

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorTorque.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsMotorTorque::VariablesFbLoadForces(ChShaftsMotorTorque *this,double factor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Scalar *pSVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
  local_30 [24];
  
  dVar4 = (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj.
          ChTime;
  (*((this->f_torque).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  ChVariables::Get_fb((ChVectorRef *)local_30,
                      &(((this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft1)->variables).
                       super_ChVariables);
  pSVar3 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_30,0);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *pSVar3;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar4;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = factor;
  auVar1 = vfmadd231sd_fma(auVar5,auVar7,auVar1);
  *pSVar3 = auVar1._0_8_;
  ChVariables::Get_fb((ChVectorRef *)local_30,
                      &(((this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft2)->variables).
                       super_ChVariables);
  pSVar3 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_30,0);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = factor;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar4;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *pSVar3;
  auVar1 = vfnmadd213sd_fma(auVar6,auVar8,auVar2);
  *pSVar3 = auVar1._0_8_;
  return;
}

Assistant:

void ChShaftsMotorTorque::VariablesFbLoadForces(double factor) {

    double imposed_torque = this->f_torque->Get_y(this->GetChTime());
    shaft1->Variables().Get_fb()(0) +=  imposed_torque * factor;
    shaft2->Variables().Get_fb()(0) += -imposed_torque * factor;
}